

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test10(void)

{
  bool bVar1;
  iterator to;
  int *piVar2;
  ostream *poVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  iterator local_80;
  undefined1 local_78 [8];
  Queue q2;
  vector<int,_std::allocator<int>_> v;
  int local_30;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  Queue q;
  
  CP::queue<int>::queue((queue<int> *)local_28);
  for (local_2c = 0; local_2c < 50000; local_2c = local_2c + 1) {
    local_30 = local_2c * 7;
    CP::queue<int>::push((queue<int> *)local_28,&local_30);
  }
  CP::queue<int>::to_vector
            ((vector<int,_std::allocator<int>_> *)&q2.mFront,(queue<int> *)local_28,0x2904);
  local_88._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&q2.mFront);
  local_80._M_current =
       (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(&local_88,0x7b);
  to = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&q2.mFront);
  CP::queue<int>::queue((queue<int> *)local_78,local_80,(iterator)to._M_current);
  while( true ) {
    bVar1 = CP::queue<int>::empty((queue<int> *)local_78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    piVar2 = CP::queue<int>::front((queue<int> *)local_78);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3," ");
    CP::queue<int>::pop((queue<int> *)local_78);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  CP::queue<int>::~queue((queue<int> *)local_78);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&q2.mFront);
  CP::queue<int>::~queue((queue<int> *)local_28);
  return true;
}

Assistant:

bool test10() {
  Queue q;
  for (int i = 0;i < 50000;i++)
    q.push(i*7);
  vector<int> v = q.to_vector(10500);
  Queue q2(v.begin() + 123, v.end());
  while (!q2.empty()) {
    cout << q2.front() << " ";
    q2.pop();
  }
  cout << endl;
  return true;
}